

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Expression::evaluate(Expression *this,shared_ptr<minja::Context> *context)

{
  undefined8 in_RDX;
  undefined8 *in_RSI;
  Value *in_RDI;
  ostringstream out;
  exception *e;
  
  (**(code **)*in_RSI)(in_RDI,in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

Value evaluate(const std::shared_ptr<Context> & context) const {
        try {
            return do_evaluate(context);
        } catch (const std::exception & e) {
            std::ostringstream out;
            out << e.what();
            if (location.source) out << error_location_suffix(*location.source, location.pos);
            throw std::runtime_error(out.str());
        }
    }